

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBench.c
# Opt level: O0

void Io_ReadBenchInit(Abc_Ntk_t *pNtk,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int Num;
  Abc_Obj_t *pObj;
  char *pToken;
  FILE *pFile;
  char pBuffer [1000];
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Io_ReadBenchInit(): Failed to open file \"%s\".\n",pFileName);
  }
  else {
    while (pcVar2 = fgets((char *)&pFile,999,__stream), pcVar2 != (char *)0x0) {
      pcVar2 = strtok((char *)&pFile," \n\t\r");
      iVar1 = Nm_ManFindIdByName(pNtk->pManName,pcVar2,5);
      if (iVar1 < 0) {
        printf("Io_ReadBenchInit(): Cannot find register with output %s.\n",pcVar2);
      }
      else {
        pAVar3 = Abc_NtkObj(pNtk,iVar1);
        pAVar3 = Abc_ObjFanin0(pAVar3);
        iVar1 = Abc_ObjIsLatch(pAVar3);
        if (iVar1 == 0) {
          printf("Io_ReadBenchInit(): The signal is not a register output %s.\n",pcVar2);
        }
        else {
          pcVar2 = strtok((char *)0x0," \n\t\r");
          if (*pcVar2 == '0') {
            Abc_LatchSetInit0(pAVar3);
          }
          else if (*pcVar2 == '1') {
            Abc_LatchSetInit1(pAVar3);
          }
          else if (*pcVar2 == '2') {
            Abc_LatchSetInitDc(pAVar3);
          }
          else {
            pAVar3 = Abc_ObjFanout0(pAVar3);
            pcVar4 = Abc_ObjName(pAVar3);
            printf("Io_ReadBenchInit(): The signal %s has unknown initial value (%s).\n",pcVar4,
                   pcVar2);
          }
        }
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Io_ReadBenchInit( Abc_Ntk_t * pNtk, char * pFileName )
{
    char pBuffer[1000];
    FILE * pFile;
    char * pToken;
    Abc_Obj_t * pObj;
    int Num;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Io_ReadBenchInit(): Failed to open file \"%s\".\n", pFileName );
        return;
    }
    while ( fgets( pBuffer, 999, pFile ) )
    {
        pToken = strtok( pBuffer, " \n\t\r" );
        // find the latch output
        Num = Nm_ManFindIdByName( pNtk->pManName, pToken, ABC_OBJ_BO );
        if ( Num < 0 )
        {
            printf( "Io_ReadBenchInit(): Cannot find register with output %s.\n", pToken );
            continue;
        }
        pObj = Abc_ObjFanin0( Abc_NtkObj( pNtk, Num ) );
        if ( !Abc_ObjIsLatch(pObj) )
        {
            printf( "Io_ReadBenchInit(): The signal is not a register output %s.\n", pToken );
            continue;
        }
        // assign the new init state
        pToken = strtok( NULL, " \n\t\r" );
        if ( pToken[0] == '0' )
            Abc_LatchSetInit0( pObj );
        else if ( pToken[0] == '1' )
            Abc_LatchSetInit1( pObj );
        else if ( pToken[0] == '2' )
            Abc_LatchSetInitDc( pObj );
        else
        {
            printf( "Io_ReadBenchInit(): The signal %s has unknown initial value (%s).\n", 
                Abc_ObjName(Abc_ObjFanout0(pObj)), pToken );
            continue;
        }
    }
    fclose( pFile );
}